

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O0

int dfsfast_r(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  Flow_Data_t *pFVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pOldPred;
  Abc_Obj_t *pNext;
  int i;
  Abc_Obj_t *pPred_local;
  Abc_Obj_t *pObj_local;
  
  if (pManMR->fSinkDistTerminate != 0) {
    return 0;
  }
  iVar3 = Abc_ObjIsLatch(pObj);
  if (((iVar3 != 0) || ((pManMR->fIsForward != 0 && (iVar3 = Abc_ObjIsPo(pObj), iVar3 != 0)))) ||
     ((pManMR->fIsForward != 0 &&
      (pFVar1 = pManMR->pDataArray, uVar4 = Abc_ObjId(pObj),
      (*(ushort *)(pFVar1 + uVar4) & 0x90 & pManMR->constraintMask) != 0)))) {
    if (pPred != (Abc_Obj_t *)0x0) {
      return 1;
    }
    __assert_fail("pPred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                  ,0x147,"int dfsfast_r(Abc_Obj_t *, Abc_Obj_t *)");
  }
  pFVar1 = pManMR->pDataArray;
  uVar4 = Abc_ObjId(pObj);
  *(ushort *)(pFVar1 + uVar4) = *(ushort *)(pFVar1 + uVar4) | 2;
  pFVar1 = pManMR->pDataArray;
  uVar4 = Abc_ObjId(pObj);
  if ((undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    pFVar1 = pManMR->pDataArray;
    uVar4 = Abc_ObjId(pObj);
    if ((undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x1) ==
        (undefined1  [24])0x0) {
      pFVar1 = pManMR->pDataArray;
      uVar4 = Abc_ObjId(pObj);
      uVar4 = *(uint *)&pFVar1[uVar4].field_0x10;
      pFVar1 = pManMR->pDataArray;
      uVar5 = Abc_ObjId(pObj);
      if ((uVar4 >> 0x10 == (*(uint *)&pFVar1[uVar5].field_0x10 & 0xffff) + 1) &&
         (iVar3 = dfsfast_e(pObj,pObj), iVar3 != 0)) {
        pFVar1 = pManMR->pDataArray;
        uVar4 = Abc_ObjId(pObj);
        *(ushort *)(pFVar1 + uVar4) = *(ushort *)(pFVar1 + uVar4) | 4;
        FSETPRED(pObj,pPred);
        goto LAB_005e832e;
      }
    }
  }
  else {
    pAVar6 = FGETPRED(pObj);
    if ((pAVar6 != (Abc_Obj_t *)0x0) &&
       (pFVar1 = pManMR->pDataArray, uVar4 = Abc_ObjId(pAVar6),
       (undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x1) ==
       (undefined1  [24])0x0)) {
      pFVar1 = pManMR->pDataArray;
      uVar4 = Abc_ObjId(pObj);
      uVar4 = *(uint *)&pFVar1[uVar4].field_0x10;
      pFVar1 = pManMR->pDataArray;
      uVar5 = Abc_ObjId(pAVar6);
      if ((uVar4 >> 0x10 == (*(uint *)&pFVar1[uVar5].field_0x10 & 0xffff) + 1) &&
         (iVar3 = dfsfast_e(pAVar6,pAVar6), iVar3 != 0)) {
        FSETPRED(pObj,pPred);
LAB_005e832e:
        pFVar1 = pManMR->pDataArray;
        uVar4 = Abc_ObjId(pObj);
        *(ushort *)(pFVar1 + uVar4) = *(ushort *)(pFVar1 + uVar4) & 0xfffd;
        return 1;
      }
    }
  }
  if (pManMR->fIsForward != 0) {
    for (pNext._4_4_ = 0; iVar3 = Abc_ObjFaninNum(pObj), pNext._4_4_ < iVar3;
        pNext._4_4_ = pNext._4_4_ + 1) {
      pAVar6 = Abc_ObjFanin(pObj,pNext._4_4_);
      pFVar1 = pManMR->pDataArray;
      uVar4 = Abc_ObjId(pAVar6);
      if ((undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x2) ==
          (undefined1  [24])0x0) {
        pFVar1 = pManMR->pDataArray;
        uVar4 = Abc_ObjId(pObj);
        uVar4 = *(uint *)&pFVar1[uVar4].field_0x10;
        pFVar1 = pManMR->pDataArray;
        uVar5 = Abc_ObjId(pAVar6);
        if (((uVar4 >> 0x10 == (*(uint *)&pFVar1[uVar5].field_0x10 >> 0x10) + 1) &&
            (iVar3 = Abc_ObjIsLatch(pAVar6), iVar3 == 0)) &&
           (iVar3 = dfsfast_r(pAVar6,pPred), iVar3 != 0)) goto LAB_005e832e;
      }
    }
    if (pManMR->maxDelay != 0) {
      pNext._4_4_ = 0;
      while( true ) {
        pVVar2 = pManMR->vTimeEdges;
        uVar4 = Abc_ObjId(pObj);
        iVar3 = Vec_PtrSize(pVVar2 + uVar4);
        if (iVar3 <= pNext._4_4_) break;
        pVVar2 = pManMR->vTimeEdges;
        uVar4 = Abc_ObjId(pObj);
        pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pVVar2 + uVar4,pNext._4_4_);
        pFVar1 = pManMR->pDataArray;
        uVar4 = Abc_ObjId(pAVar6);
        if ((undefined1  [24])((undefined1  [24])pFVar1[uVar4] & (undefined1  [24])0x2) ==
            (undefined1  [24])0x0) {
          pFVar1 = pManMR->pDataArray;
          uVar4 = Abc_ObjId(pObj);
          uVar4 = *(uint *)&pFVar1[uVar4].field_0x10;
          pFVar1 = pManMR->pDataArray;
          uVar5 = Abc_ObjId(pAVar6);
          if ((uVar4 >> 0x10 == (*(uint *)&pFVar1[uVar5].field_0x10 >> 0x10) + 1) &&
             (iVar3 = dfsfast_r(pAVar6,pPred), iVar3 != 0)) goto LAB_005e832e;
        }
        pNext._4_4_ = pNext._4_4_ + 1;
      }
    }
  }
  pFVar1 = pManMR->pDataArray;
  uVar4 = Abc_ObjId(pObj);
  *(ushort *)(pFVar1 + uVar4) = *(ushort *)(pFVar1 + uVar4) & 0xfffd;
  dfsfast_r_retreat(pObj);
  return 0;
}

Assistant:

int dfsfast_r( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext, *pOldPred;

  if (pManMR->fSinkDistTerminate) return 0;

#ifdef DEBUG_VISITED
  printf("(%dr=%d) ", Abc_ObjId(pObj), FDATA(pObj)->r_dist);
#endif  

  // have we reached the sink?
  if (Abc_ObjIsLatch(pObj) ||
      (pManMR->fIsForward && Abc_ObjIsPo(pObj)) || 
      (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
    assert(pPred);
    return 1;
  }

  FSET(pObj, VISITED_R);

  if (FTEST(pObj, FLOW)) {

    pOldPred = FGETPRED(pObj);
    if (pOldPred && 
        !FTEST(pOldPred, VISITED_E) &&
        FDIST(pObj, r, pOldPred, e) &&
        dfsfast_e(pOldPred, pOldPred)) {

      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("fr");
#endif
      goto found;
    }
    
  } else {

    if (!FTEST(pObj, VISITED_E) &&
        FDIST(pObj, r, pObj, e) &&
        dfsfast_e(pObj, pObj)) {

      FSET(pObj, FLOW);
      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("f");
#endif
      goto found;
    }
  }
 
  // 2. reverse edges (forward retiming only)
  if (pManMR->fIsForward) {
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          FDIST(pObj, r, pNext, r) &&
          !Abc_ObjIsLatch(pNext) &&
          dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }
  
  // 3. timing edges (forward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_R) &&
            FDIST(pObj, r, pNext, r) &&
            dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  FUNSET(pObj, VISITED_R);
  dfsfast_r_retreat(pObj);
  return 0;

 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif
  FUNSET(pObj, VISITED_R);
  return 1;
}